

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_fgrid(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_GRID pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  FILE *__stream;
  REF_INT RVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  REF_INT *o2n;
  REF_INT *n2o;
  REF_INT nodes [27];
  REF_INT *local_c0;
  REF_GRID local_b8;
  REF_INT *local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x49d,
           "ref_export_fgrid","unable to open file");
    uVar3 = 2;
  }
  else {
    iVar8 = 0;
    fprintf(__stream,"%d %d %d\n",(ulong)(uint)ref_node->n,(ulong)(uint)ref_grid->cell[3]->n,
            (ulong)(uint)ref_grid->cell[8]->n);
    uVar3 = ref_node_compact(ref_node,&local_c0,&local_b0);
    local_b8 = ref_grid;
    if (uVar3 == 0) {
      do {
        if (0 < ref_node->n) {
          lVar6 = 0;
          do {
            fprintf(__stream," %.16e\n",ref_node->real[(long)local_b0[lVar6] * 0xf + (long)iVar8]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < ref_node->n);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 3);
      pRVar1 = local_b8->cell[3];
      if (0 < pRVar1->max) {
        uVar3 = pRVar1->node_per;
        RVar5 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar1,RVar5,local_a8);
          if (RVar4 == 0) {
            if (0 < (int)uVar3) {
              uVar7 = 0;
              do {
                fprintf(__stream," %d",(ulong)(local_c0[local_a8[uVar7]] + 1));
                uVar7 = uVar7 + 1;
              } while (uVar3 != uVar7);
            }
            fputc(10,__stream);
          }
          RVar5 = RVar5 + 1;
        } while (RVar5 < pRVar1->max);
      }
      pRVar2 = local_b8;
      if (0 < pRVar1->max) {
        RVar5 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar1,RVar5,local_a8);
          if (RVar4 == 0) {
            fprintf(__stream," %d",(ulong)(uint)local_a8[3]);
            fputc(10,__stream);
          }
          RVar5 = RVar5 + 1;
        } while (RVar5 < pRVar1->max);
      }
      pRVar1 = pRVar2->cell[8];
      if (0 < pRVar1->max) {
        uVar3 = pRVar1->node_per;
        RVar5 = 0;
        do {
          RVar4 = ref_cell_nodes(pRVar1,RVar5,local_a8);
          if (RVar4 == 0) {
            if (0 < (int)uVar3) {
              uVar7 = 0;
              do {
                fprintf(__stream," %d",(ulong)(local_c0[local_a8[uVar7]] + 1));
                uVar7 = uVar7 + 1;
              } while (uVar3 != uVar7);
            }
            fputc(10,__stream);
          }
          RVar5 = RVar5 + 1;
        } while (RVar5 < pRVar1->max);
      }
      if (local_b0 != (REF_INT *)0x0) {
        free(local_b0);
      }
      if (local_c0 != (REF_INT *)0x0) {
        free(local_c0);
      }
      fclose(__stream);
      uVar3 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x4a7,"ref_export_fgrid",(ulong)uVar3,"compact");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_fgrid(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri, ntet;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT ixyz;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  ntri = ref_cell_n(ref_grid_tri(ref_grid));

  ntet = ref_cell_n(ref_grid_tet(ref_grid));

  fprintf(file, "%d %d %d\n", nnode, ntri, ntet);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (ixyz = 0; ixyz < 3; ixyz++)
    for (node = 0; node < ref_node_n(ref_node); node++)
      fprintf(file, " %.16e\n", ref_node_xyz(ref_node, ixyz, n2o[node]));

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < node_per; node++)
      fprintf(file, " %d", o2n[nodes[node]] + 1);
    fprintf(file, "\n");
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(file, " %d", nodes[3]);
    fprintf(file, "\n");
  }

  ref_cell = ref_grid_tet(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < node_per; node++)
      fprintf(file, " %d", o2n[nodes[node]] + 1);
    fprintf(file, "\n");
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}